

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.hpp
# Opt level: O2

value * __thiscall
lightconf::group::
find_value<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (group *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last,group **parent_group,path *key_rest)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  path_error *this_00;
  allocator local_61;
  path *local_60;
  string local_58;
  
  local_60 = key_rest;
  while( true ) {
    if (first._M_current == last._M_current) {
      this_00 = (path_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_58,"value at empty path requested",&local_61);
      path_error::path_error(this_00,&local_58);
      __cxa_throw(this_00,&path_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
                    *)this,first._M_current);
    p_Var1 = &(this->values_)._M_t._M_impl.super__Rb_tree_header;
    if (first._M_current == last._M_current + -1) break;
    if (((_Rb_tree_header *)cVar2._M_node == p_Var1) || (cVar2._M_node[2]._M_color != 4)) {
      *parent_group = this;
      path::
      path<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((path *)&local_58,first,last);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_60->parts_,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
      goto LAB_0011363f;
    }
    this = value::get<lightconf::group>((value *)(cVar2._M_node + 2));
    first._M_current = first._M_current + 1;
  }
  *parent_group = this;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var1) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_60->parts_,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    return (value *)(cVar2._M_node + 2);
  }
  path::
  path<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((path *)&local_58,first,last);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_60->parts_,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
LAB_0011363f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  return (value *)0x0;
}

Assistant:

inline const value *group::find_value(InputIterator first, InputIterator last,
        const group **parent_group, path *key_rest) const {

    if (first == last) {
        throw path_error("value at empty path requested");
    }

    auto it = values_.find(*first);
    if (first == last - 1) {
        if (it == values_.end()) {
            *parent_group = this;
            *key_rest = path(first, last);
            return 0;
        } else {
            *parent_group = this;
            *key_rest = path();
            return &it->second;
        }
    } else {
        if (it == values_.end() || !it->second.template is<group>()) {
            *parent_group = this;
            *key_rest = path(first, last);
            return 0;
        } else {
            const group& grp = it->second.template get<group>();
            return grp.find_value(first + 1, last, parent_group, key_rest);
        }
    }
}